

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall
re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  StringPiece *pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  int iVar7;
  uint __c;
  iterator pcVar8;
  iterator pcVar9;
  ulong uVar10;
  uint32 *puVar11;
  char **ppcVar12;
  Job *pJVar13;
  byte *pbVar14;
  bool local_7a;
  bool local_79;
  byte *pbStack_58;
  int fb;
  char *p;
  int local_48;
  int local_3c;
  StringPiece *pSStack_38;
  int i;
  StringPiece *submatch_local;
  bool longest_local;
  StringPiece *pSStack_28;
  bool anchored_local;
  StringPiece *context_local;
  StringPiece *text_local;
  BitState *this_local;
  
  (this->text_).ptr_ = text->ptr_;
  (this->text_).length_ = text->length_;
  (this->context_).ptr_ = context->ptr_;
  (this->context_).length_ = context->length_;
  pSStack_38 = submatch;
  submatch_local._6_1_ = longest;
  submatch_local._7_1_ = anchored;
  pSStack_28 = context;
  context_local = text;
  text_local = (StringPiece *)this;
  pcVar8 = StringPiece::begin(&this->context_);
  if (pcVar8 == (iterator)0x0) {
    (this->context_).ptr_ = context_local->ptr_;
    (this->context_).length_ = context_local->length_;
  }
  bVar5 = Prog::anchor_start(this->prog_);
  if (bVar5) {
    pcVar8 = StringPiece::begin(&this->context_);
    pcVar9 = StringPiece::begin(context_local);
    if (pcVar8 != pcVar9) {
      return false;
    }
  }
  bVar5 = Prog::anchor_end(this->prog_);
  if (bVar5) {
    pcVar8 = StringPiece::end(&this->context_);
    pcVar9 = StringPiece::end(context_local);
    if (pcVar8 != pcVar9) {
      return false;
    }
  }
  local_79 = true;
  if ((submatch_local._7_1_ & 1) == 0) {
    local_79 = Prog::anchor_start(this->prog_);
  }
  this->anchored_ = local_79;
  local_7a = true;
  if ((submatch_local._6_1_ & 1) == 0) {
    local_7a = Prog::anchor_end(this->prog_);
  }
  this->longest_ = local_7a;
  bVar5 = Prog::anchor_end(this->prog_);
  this->endmatch_ = bVar5;
  this->submatch_ = pSStack_38;
  this->nsubmatch_ = nsubmatch;
  for (local_3c = 0; local_3c < this->nsubmatch_; local_3c = local_3c + 1) {
    StringPiece::StringPiece((StringPiece *)&p,(char *)0x0);
    pSVar1 = this->submatch_;
    pSVar1[local_3c].ptr_ = p;
    pSVar1[local_3c].length_ = local_48;
  }
  iVar6 = Prog::size(this->prog_);
  iVar7 = StringPiece::size(context_local);
  this->nvisited_ = (iVar6 * (iVar7 + 1) + 0x1f) / 0x20;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->nvisited_;
  uVar10 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar11 = (uint32 *)operator_new__(uVar10);
  this->visited_ = puVar11;
  memset(this->visited_,0,(long)this->nvisited_ << 2);
  this->ncap_ = nsubmatch << 1;
  if (this->ncap_ < 2) {
    this->ncap_ = 2;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->ncap_;
  uVar10 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  ppcVar12 = (char **)operator_new__(uVar10);
  this->cap_ = ppcVar12;
  memset(this->cap_,0,(long)this->ncap_ << 3);
  this->maxjob_ = 0x100;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->maxjob_;
  uVar10 = SUB168(auVar4 * ZEXT816(0x10),0);
  if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pJVar13 = (Job *)operator_new__(uVar10);
  this->job_ = pJVar13;
  if ((this->anchored_ & 1U) == 0) {
    for (pbStack_58 = (byte *)StringPiece::begin(context_local);
        pbVar14 = (byte *)StringPiece::end(context_local), pbStack_58 <= pbVar14;
        pbStack_58 = pbStack_58 + 1) {
      __c = Prog::first_byte(this->prog_);
      if (((-1 < (int)__c) &&
          (pbVar14 = (byte *)StringPiece::end(context_local), pbStack_58 < pbVar14)) &&
         (*pbStack_58 != __c)) {
        pcVar8 = StringPiece::end(context_local);
        pbStack_58 = (byte *)memchr(pbStack_58,__c,(long)pcVar8 - (long)pbStack_58);
        if (pbStack_58 == (byte *)0x0) {
          pbStack_58 = (byte *)StringPiece::end(context_local);
        }
      }
      *this->cap_ = (char *)pbStack_58;
      iVar6 = Prog::start(this->prog_);
      bVar5 = TrySearch(this,iVar6,(char *)pbStack_58);
      if (bVar5) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    pcVar8 = StringPiece::begin(context_local);
    *this->cap_ = pcVar8;
    iVar6 = Prog::start(this->prog_);
    pcVar8 = StringPiece::begin(context_local);
    this_local._7_1_ = TrySearch(this,iVar6,pcVar8);
  }
  return this_local._7_1_;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.begin() == NULL)
    context_ = text;
  if (prog_->anchor_start() && context_.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context_.end() != text.end())
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = NULL;

  // Allocate scratch space.
  nvisited_ = (prog_->size() * (text.size()+1) + VisitedBits-1) / VisitedBits;
  visited_ = new uint32[nvisited_];
  memset(visited_, 0, nvisited_*sizeof visited_[0]);
  // VLOG(0) << "nvisited_ = " << nvisited_;

  ncap_ = 2*nsubmatch;
  if (ncap_ < 2)
    ncap_ = 2;
  cap_ = new const char*[ncap_];
  memset(cap_, 0, ncap_*sizeof cap_[0]);

  maxjob_ = 256;
  job_ = new Job[maxjob_];

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.begin();
    return TrySearch(prog_->start(), text.begin());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  for (const char* p = text.begin(); p <= text.end(); p++) {
    // Try to use memchr to find the first byte quickly.
    int fb = prog_->first_byte();
    if (fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
      p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
      if (p == NULL)
        p = text.end();
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}